

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

exr_attr_box2i_t __thiscall Imf_3_4::Context::dataWindow(Context *this,int partidx)

{
  int iVar1;
  element_type *pp_Var2;
  ostream *poVar3;
  char *pcVar4;
  ArgExc *this_00;
  int in_ESI;
  stringstream _iex_throw_s;
  exr_attr_box2i_t dw;
  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffe10;
  stringstream local_1a8 [16];
  ostream local_198 [328];
  Context *in_stack_ffffffffffffffb0;
  exr_attr_box2i_t local_10;
  
  pp_Var2 = std::
            __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*(in_stack_fffffffffffffe10);
  iVar1 = exr_get_data_window(*pp_Var2,in_ESI,&local_10);
  if (iVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar3 = std::operator<<(local_198,"Unable to get the data window for part ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ESI);
    poVar3 = std::operator<<(poVar3," in file \'");
    pcVar4 = fileName(in_stack_ffffffffffffffb0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\'");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,local_1a8);
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  return local_10;
}

Assistant:

exr_attr_box2i_t
Context::dataWindow (int partidx) const
{
    exr_attr_box2i_t dw;

    if (EXR_ERR_SUCCESS != exr_get_data_window (*_ctxt, partidx, &dw))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Unable to get the data window for part " << partidx << " in file '"
                                                      << fileName () << "'");
    }

    return dw;
}